

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intlog.hpp
# Opt level: O2

unsigned_long burst::detail::intlog_impl<unsigned_long>(unsigned_long number,unsigned_long base)

{
  unsigned_long uVar1;
  long lVar2;
  unsigned_long exponent;
  
  lVar2 = 0;
  for (uVar1 = base; uVar1 < number; uVar1 = uVar1 * base) {
    lVar2 = lVar2 + 1;
  }
  return (ulong)(uVar1 == number) + lVar2;
}

Assistant:

constexpr Integer intlog_impl (Integer number, Integer base)
        {
            auto degree = Integer{0};
            auto exponent = base;

            while (exponent < number)
            {
                exponent *= base;
                ++degree;
            }

            if (exponent == number)
            {
                return degree + 1;
            }
            else
            {
                return degree;
            }
        }